

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O3

void telnet_send_zmp(telnet_t *telnet,size_t argc,char **argv)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char local_52 [2];
  telnet_event_t local_50;
  
  telnet_begin_zmp(telnet,*argv);
  if (argc != 1) {
    sVar2 = 1;
    do {
      __s = argv[sVar2];
      sVar1 = strlen(__s);
      telnet_send(telnet,__s,sVar1 + 1);
      sVar2 = sVar2 + 1;
    } while (argc != sVar2);
  }
  local_50.data.buffer = local_52;
  local_52[0] = -1;
  local_52[1] = -0x10;
  local_50.type = TELNET_EV_SEND;
  local_50.data.size = 2;
  (*telnet->eh)(telnet,&local_50,telnet->ud);
  return;
}

Assistant:

void telnet_send_zmp(telnet_t *telnet, size_t argc, const char **argv) {
	size_t i;

	/* ZMP header */
	telnet_begin_zmp(telnet, argv[0]);

	/* send out each argument, including trailing NUL byte */
	for (i = 1; i != argc; ++i)
		telnet_zmp_arg(telnet, argv[i]);

	/* ZMP footer */
	telnet_finish_zmp(telnet);
}